

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_hkdf(void)

{
  ptls_hash_algorithm_t *algo;
  ptls_iovec_t info_00;
  int iVar1;
  ptls_cipher_suite_t *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ptls_iovec_t salt;
  ptls_iovec_t prk_00;
  ptls_iovec_t ikm_00;
  char info [11];
  char ikm [23];
  uint8_t okm [42];
  uint8_t prk [64];
  uint8_t local_c8 [16];
  uint8_t local_b8 [32];
  undefined1 local_98 [48];
  uint8_t local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  
  ppVar2 = find_aes128gcmsha256((ptls_context_t *)ctx->cipher_suites);
  algo = ppVar2->hash;
  builtin_memcpy(local_b8,"\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v",0x17);
  local_c8[0] = 0xf0;
  local_c8[1] = 0xf1;
  local_c8[2] = 0xf2;
  local_c8[3] = 0xf3;
  local_c8[4] = 0xf4;
  local_c8[5] = 0xf5;
  local_c8[6] = 0xf6;
  local_c8[7] = 0xf7;
  local_c8[8] = 0xf8;
  local_c8[9] = 0xf9;
  local_c8[10] = '\0';
  salt.len = 0xd;
  salt.base = "";
  ikm_00.len = 0x16;
  ikm_00.base = local_b8;
  ptls_hkdf_extract(algo,&local_68,salt,ikm_00);
  auVar3[0] = -(local_58 == -0x70);
  auVar3[1] = -(cStack_57 == -0x4a);
  auVar3[2] = -(cStack_56 == -0x39);
  auVar3[3] = -(cStack_55 == ';');
  auVar3[4] = -(cStack_54 == -0x4b);
  auVar3[5] = -(cStack_53 == '\x0f');
  auVar3[6] = -(cStack_52 == -100);
  auVar3[7] = -(cStack_51 == '1');
  auVar3[8] = -(cStack_50 == '\"');
  auVar3[9] = -(cStack_4f == -0x14);
  auVar3[10] = -(cStack_4e == -0x7c);
  auVar3[0xb] = -(cStack_4d == 'J');
  auVar3[0xc] = -(cStack_4c == -0x29);
  auVar3[0xd] = -(cStack_4b == -0x3e);
  auVar3[0xe] = -(cStack_4a == -0x4d);
  auVar3[0xf] = -(cStack_49 == -0x1b);
  auVar4[0] = -(local_68 == '\a');
  auVar4[1] = -(cStack_67 == 'w');
  auVar4[2] = -(cStack_66 == '\t');
  auVar4[3] = -(cStack_65 == '6');
  auVar4[4] = -(cStack_64 == ',');
  auVar4[5] = -(cStack_63 == '.');
  auVar4[6] = -(cStack_62 == '2');
  auVar4[7] = -(cStack_61 == -0x21);
  auVar4[8] = -(cStack_60 == '\r');
  auVar4[9] = -(cStack_5f == -0x24);
  auVar4[10] = -(cStack_5e == '?');
  auVar4[0xb] = -(cStack_5d == '\r');
  auVar4[0xc] = -(cStack_5c == -0x3c);
  auVar4[0xd] = -(cStack_5b == '{');
  auVar4[0xe] = -(cStack_5a == -0x46);
  auVar4[0xf] = -(cStack_59 == 'c');
  auVar4 = auVar4 & auVar3;
  _ok((uint)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x43);
  info_00.len = 10;
  info_00.base = local_c8;
  prk_00.len = algo->digest_size;
  prk_00.base = &local_68;
  ptls_hkdf_expand(algo,local_98,0x2a,prk_00,info_00);
  iVar1 = bcmp(local_98,anon_var_dwarf_dad8,0x2a);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x48);
  return;
}

Assistant:

static void test_hkdf(void)
{
    ptls_hash_algorithm_t *sha256 = find_aes128gcmsha256(ctx)->hash;
    const char salt[] = "\x00\x01\x02\x03\x04\x05\x06\x07\x08\x09\x0a\x0b\x0c";
    const char ikm[] = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b";
    const char info[] = "\xf0\xf1\xf2\xf3\xf4\xf5\xf6\xf7\xf8\xf9";
    uint8_t prk[PTLS_MAX_DIGEST_SIZE];
    uint8_t okm[42];

    ptls_hkdf_extract(sha256, prk, ptls_iovec_init(salt, sizeof(salt) - 1), ptls_iovec_init(ikm, sizeof(ikm) - 1));
    ok(memcmp(prk, "\x07\x77\x09\x36\x2c\x2e\x32\xdf\x0d\xdc\x3f\x0d\xc4\x7b\xba\x63\x90\xb6\xc7\x3b\xb5\x0f\x9c\x31\x22\xec\x84"
                   "\x4a\xd7\xc2\xb3\xe5",
              32) == 0);

    ptls_hkdf_expand(sha256, okm, sizeof(okm), ptls_iovec_init(prk, sha256->digest_size), ptls_iovec_init(info, sizeof(info) - 1));
    ok(memcmp(okm, "\x3c\xb2\x5f\x25\xfa\xac\xd5\x7a\x90\x43\x4f\x64\xd0\x36\x2f\x2a\x2d\x2d\x0a\x90\xcf\x1a\x5a\x4c\x5d\xb0\x2d"
                   "\x56\xec\xc4\xc5\xbf\x34\x00\x72\x08\xd5\xb8\x87\x18\x58\x65",
              sizeof(okm)) == 0);
}